

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

CordRepKind __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::RepRef::tag(RepRef *this)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  CordRep *pCVar3;
  CordRepKind CVar4;
  uint uVar5;
  sbyte sVar6;
  CordRep *pCVar7;
  int iVar8;
  size_t extraout_RDX;
  long lVar9;
  sbyte sVar10;
  CordRep *in_RSI;
  long lVar11;
  int iVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RepRef RStack_38;
  
  pCVar7 = this->rep;
  if (pCVar7 == (CordRep *)0x0) {
    return UNUSED_0;
  }
  if (pCVar7->tag == '\0') {
    cord_internal::(anonymous_namespace)::CordRepAnalyzer::RepRef::tag();
    RStack_38.rep = in_RSI;
    RStack_38.refcount = extraout_RDX;
    CVar4 = tag(&RStack_38);
    sVar13 = extraout_RDX;
    if (CVar4 == SUBSTRING) {
      do {
        pCVar3 = this->rep;
        pRVar1 = &pCVar3[1].refcount;
        *(long *)pRVar1 = *(long *)pRVar1 + 1;
        pRVar1 = &pCVar3[5].refcount;
        *(long *)pRVar1 = *(long *)pRVar1 + 1;
        pCVar7->length = pCVar7->length + 0x20;
        auVar14._8_4_ = (int)(sVar13 >> 0x20);
        auVar14._0_8_ = sVar13;
        auVar14._12_4_ = 0x45300000;
        *(double *)&pCVar7->refcount =
             32.0 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0)) +
             *(double *)&pCVar7->refcount;
        if ((RStack_38.rep)->tag != '\x01') {
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x380,
                        "const CordRepSubstring *absl::cord_internal::CordRep::substring() const");
        }
        RStack_38.rep = *(CordRep **)&RStack_38.rep[1].refcount;
        if (RStack_38.rep == (CordRep *)0x0) {
          RStack_38.rep = (CordRep *)0x0;
          sVar13 = 0;
        }
        else {
          sVar13 = sVar13 * (long)(((RStack_38.rep)->refcount).count_.super___atomic_base<int>._M_i
                                  >> 1);
        }
        RStack_38.refcount = sVar13;
        CVar4 = tag(&RStack_38);
      } while (CVar4 == SUBSTRING);
    }
    CVar4 = tag(&RStack_38);
    if (CVar4 < FLAT) {
      CVar4 = tag(&RStack_38);
      if (CVar4 != EXTERNAL) {
        return (CordRepKind)RStack_38.rep;
      }
      pCVar3 = this->rep;
      pRVar1 = &pCVar3[1].refcount;
      *(long *)pRVar1 = *(long *)pRVar1 + 1;
      pCVar3 = pCVar3 + 5;
      pCVar3->length = pCVar3->length + 1;
      lVar9 = (RStack_38.rep)->length + 0x28;
      pCVar7->length = pCVar7->length + lVar9;
    }
    else {
      bVar2 = (RStack_38.rep)->tag;
      if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      iVar8 = -0xb8000;
      if (bVar2 < 0xbb) {
        iVar8 = -0xe80;
      }
      sVar10 = 0xc;
      if (bVar2 < 0xbb) {
        sVar10 = 6;
      }
      iVar12 = -0x10;
      if (0x42 < bVar2) {
        iVar12 = iVar8;
      }
      sVar6 = 3;
      if (0x42 < bVar2) {
        sVar6 = sVar10;
      }
      pCVar3 = this->rep;
      *(long *)&pCVar3[1].refcount = *(long *)&pCVar3[1].refcount + 1;
      pCVar3[2].length = pCVar3[2].length + 1;
      uVar5 = ((uint)bVar2 << sVar6) + iVar12;
      lVar9 = (long)(int)uVar5;
      lVar11 = 0x28;
      if ((((uVar5 < 0x41) || (lVar11 = 0x30, uVar5 < 0x81)) || (lVar11 = 0x38, uVar5 < 0x101)) ||
         ((lVar11 = 0x40, uVar5 < 0x201 || (lVar11 = 0x48, uVar5 < 0x401)))) {
        *(long *)(pCVar3->storage + lVar11 + -0xd) = *(long *)(pCVar3->storage + lVar11 + -0xd) + 1;
      }
      pCVar7->length = pCVar7->length + lVar9;
    }
    auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = 0x45300000;
    auVar16._8_4_ = (int)(sVar13 >> 0x20);
    auVar16._0_8_ = sVar13;
    auVar16._12_4_ = 0x45300000;
    *(double *)&pCVar7->refcount =
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0)) +
         *(double *)&pCVar7->refcount;
    return UNUSED_0;
  }
  if (pCVar7 == (CordRep *)0x0) {
    return UNUSED_0;
  }
  return (uint)pCVar7->tag;
}

Assistant:

constexpr CordRepKind tag() const {
      ABSL_ASSERT(rep == nullptr || rep->tag != CordRepKind::UNUSED_0);
      return rep ? static_cast<CordRepKind>(rep->tag) : CordRepKind::UNUSED_0;
    }